

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::
PropagateDateTruncStatistics<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::MonthOperator>
          (ClientContext *context,FunctionStatisticsInput *input)

{
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> in_RDI;
  vector<duckdb::BaseStatistics,_true> *in_stack_00000128;
  
  DateTruncStatistics<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::MonthOperator>
            (in_stack_00000128);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDateTruncStatistics(ClientContext &context, FunctionStatisticsInput &input) {
	return DateTruncStatistics<TA, TR, OP>(input.child_stats);
}